

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O2

SimpleString StringFrom(double value,int precision)

{
  int iVar1;
  uint in_ESI;
  char *otherBuffer;
  undefined4 in_register_0000003c;
  SimpleString *this;
  
  this = (SimpleString *)CONCAT44(in_register_0000003c,precision);
  iVar1 = (*PlatformSpecificIsNan)(value);
  if (iVar1 == 0) {
    iVar1 = (*PlatformSpecificIsInf)(value);
    if (iVar1 == 0) {
      StringFromFormat((char *)this,value,"%.*g",(ulong)in_ESI);
      return (SimpleString)(char *)this;
    }
    otherBuffer = "Inf - Infinity";
  }
  else {
    otherBuffer = "Nan - Not a number";
  }
  SimpleString::SimpleString(this,otherBuffer);
  return (SimpleString)(char *)this;
}

Assistant:

SimpleString StringFrom(double value, int precision)
{
    if (PlatformSpecificIsNan(value))
        return "Nan - Not a number";
    else if (PlatformSpecificIsInf(value))
        return "Inf - Infinity";
    else
        return StringFromFormat("%.*g", precision, value);
}